

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest-port.cc
# Opt level: O1

string * testing::internal::OutputFlagAlsoCheckEnvVar_abi_cxx11_(void)

{
  char *pcVar1;
  long *plVar2;
  long *plVar3;
  string *in_RDI;
  long *local_60;
  long local_58;
  long local_50;
  long lStack_48;
  undefined1 *local_40 [2];
  undefined1 local_30 [16];
  
  (in_RDI->_M_dataplus)._M_p = (pointer)&in_RDI->field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)in_RDI,"");
  pcVar1 = getenv("XML_OUTPUT_FILE");
  if (pcVar1 != (char *)0x0) {
    local_40[0] = local_30;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_40,"xml:","");
    plVar2 = (long *)std::__cxx11::string::append((char *)local_40);
    plVar3 = plVar2 + 2;
    if ((long *)*plVar2 == plVar3) {
      local_50 = *plVar3;
      lStack_48 = plVar2[3];
      local_60 = &local_50;
    }
    else {
      local_50 = *plVar3;
      local_60 = (long *)*plVar2;
    }
    local_58 = plVar2[1];
    *plVar2 = (long)plVar3;
    plVar2[1] = 0;
    *(undefined1 *)(plVar2 + 2) = 0;
    std::__cxx11::string::operator=((string *)in_RDI,(string *)&local_60);
    if (local_60 != &local_50) {
      operator_delete(local_60);
    }
    if (local_40[0] != local_30) {
      operator_delete(local_40[0]);
    }
  }
  return in_RDI;
}

Assistant:

std::string OutputFlagAlsoCheckEnvVar(){
  std::string default_value_for_output_flag = "";
  const char* xml_output_file_env = posix::GetEnv("XML_OUTPUT_FILE");
  if (NULL != xml_output_file_env) {
    default_value_for_output_flag = std::string("xml:") + xml_output_file_env;
  }
  return default_value_for_output_flag;
}